

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

string * __thiscall bsim::quad_value::binary_string_abi_cxx11_(quad_value *this)

{
  char *in_RSI;
  string *in_RDI;
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11 [17];
  
  if (*in_RSI == '\x01') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"1",local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  else if (*in_RSI == '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"0",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else if (*in_RSI == '\x02') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"x",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else {
    if (*in_RSI != '\x03') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                    ,0x86,"std::string bsim::quad_value::binary_string() const");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"z",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
  }
  return in_RDI;
}

Assistant:

std::string binary_string() const {
      if (value == 1) {
        return "1";
      } else if (value == 0) {
        return "0";
      } else if (value == QBV_UNKNOWN_VALUE) {
        return "x";
      } else if (value == QBV_HIGH_IMPEDANCE_VALUE) {
        return "z";
      }
      assert(false);
    }